

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

Image * GenImageGradientLinear
                  (Image *__return_storage_ptr__,int width,int height,int direction,Color start,
                  Color end)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  undefined1 auVar18 [11];
  undefined1 auVar19 [14];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  uint6 uVar24;
  uint6 uVar25;
  undefined1 auVar26 [16];
  char *pcVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  char *pcVar31;
  char *pcVar32;
  ulong uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  ushort uVar38;
  short sVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar44 [16];
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar42;
  undefined6 uVar43;
  
  pcVar27 = (char *)malloc((long)(height * width) << 2);
  fVar34 = ((float)(0x5a - direction) / 180.0) * 3.14159;
  fVar35 = cosf(fVar34);
  fVar36 = sinf(fVar34);
  auVar26 = _DAT_001bf800;
  fVar37 = (0.5 - (float)width * fVar35 * 0.5) - (float)height * fVar36 * 0.5;
  fVar34 = fVar37;
  if ((int)((uint)fVar36 ^ (uint)fVar35) < 0) {
    fVar34 = (float)width * fVar35 + fVar37;
  }
  Var14 = CONCAT81(SUB158(ZEXT815(0),7),end.a);
  auVar20._9_6_ = 0;
  auVar20._0_9_ = Var14;
  auVar15._1_10_ = SUB1510(auVar20 << 0x30,5);
  auVar15[0] = end.b;
  auVar21._11_4_ = 0;
  auVar21._0_11_ = auVar15;
  auVar16._1_12_ = SUB1512(auVar21 << 0x20,3);
  auVar16[0] = end.g;
  uVar38 = CONCAT11(0,end.r);
  auVar13._2_13_ = auVar16;
  auVar13._0_2_ = uVar38;
  auVar9._10_2_ = 0;
  auVar9._0_10_ = auVar13._0_10_;
  auVar9._12_2_ = (short)Var14;
  uVar24 = CONCAT42(auVar9._10_4_,auVar15._0_2_);
  auVar17._6_8_ = 0;
  auVar17._0_6_ = uVar24;
  Var14 = CONCAT81(SUB158(ZEXT815(0),7),start.a);
  auVar22._9_6_ = 0;
  auVar22._0_9_ = Var14;
  auVar18._1_10_ = SUB1510(auVar22 << 0x30,5);
  auVar18[0] = start.b;
  auVar23._11_4_ = 0;
  auVar23._0_11_ = auVar18;
  auVar11[2] = start.g;
  auVar11._0_2_ = start._0_2_;
  auVar11._3_12_ = SUB1512(auVar23 << 0x20,3);
  auVar12._2_13_ = auVar11._2_13_;
  auVar12._0_2_ = start._0_2_ & 0xff;
  auVar8._10_2_ = 0;
  auVar8._0_10_ = auVar12._0_10_;
  auVar8._12_2_ = (short)Var14;
  uVar25 = CONCAT42(auVar8._10_4_,auVar18._0_2_);
  auVar19._6_8_ = 0;
  auVar19._0_6_ = uVar25;
  auVar10._4_2_ = auVar11._2_2_;
  auVar10._0_4_ = auVar12._0_4_;
  auVar10._6_8_ = SUB148(auVar19 << 0x40,6);
  uVar28 = 0;
  uVar29 = 0;
  if (0 < height) {
    uVar29 = (ulong)(uint)height;
  }
  uVar30 = 0;
  if (0 < width) {
    uVar30 = (ulong)(uint)width;
  }
  pcVar31 = pcVar27;
  for (; uVar28 != uVar30; uVar28 = uVar28 + 1) {
    pcVar32 = pcVar31;
    for (uVar33 = 0; uVar29 != uVar33; uVar33 = uVar33 + 1) {
      fVar40 = ((float)(int)uVar33 * fVar36 + (float)(int)uVar28 * fVar35 + fVar37) / ABS(fVar34);
      fVar41 = 1.0;
      if (fVar40 <= 1.0) {
        fVar41 = fVar40;
      }
      fVar40 = -1.0;
      if (-1.0 <= fVar41) {
        fVar40 = fVar41;
      }
      fVar41 = fVar40 * 0.5 + 0.5;
      fVar40 = 1.0 - fVar41;
      auVar44._0_4_ = (int)(fVar40 * (float)(auVar12._0_4_ & 0xffff) + fVar41 * (float)uVar38);
      auVar44._4_4_ =
           (int)(fVar40 * (float)auVar10._4_4_ +
                fVar41 * (float)(int)CONCAT82(SUB148(auVar17 << 0x40,6),auVar16._0_2_));
      auVar44._8_4_ = (int)(fVar40 * (float)(int)uVar25 + fVar41 * (float)(int)uVar24);
      auVar44._12_4_ =
           (int)(fVar40 * (float)(auVar8._10_4_ >> 0x10) + fVar41 * (float)(auVar9._10_4_ >> 0x10));
      auVar44 = auVar44 & auVar26;
      sVar5 = auVar44._0_2_;
      cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar44[0] - (0xff < sVar5);
      sVar5 = auVar44._2_2_;
      sVar39 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar44[2] - (0xff < sVar5),cVar1);
      sVar5 = auVar44._4_2_;
      cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar44[4] - (0xff < sVar5);
      sVar5 = auVar44._6_2_;
      uVar42 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar44[6] - (0xff < sVar5),
                        CONCAT12(cVar2,sVar39));
      sVar5 = auVar44._8_2_;
      cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar44[8] - (0xff < sVar5);
      sVar5 = auVar44._10_2_;
      uVar43 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar44[10] - (0xff < sVar5),
                        CONCAT14(cVar3,uVar42));
      sVar5 = auVar44._12_2_;
      cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar44[0xc] - (0xff < sVar5);
      sVar7 = auVar44._14_2_;
      sVar5 = (short)((uint)uVar42 >> 0x10);
      sVar6 = (short)((uint6)uVar43 >> 0x20);
      sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar44[0xe] - (0xff < sVar7),
                               CONCAT16(cVar4,uVar43)) >> 0x30);
      *pcVar32 = (0 < sVar39) * (sVar39 < 0x100) * cVar1 - (0xff < sVar39);
      pcVar32[1] = (0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5);
      pcVar32[2] = (0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6);
      pcVar32[3] = (0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7);
      pcVar32 = pcVar32 + (long)width * 4;
    }
    pcVar31 = pcVar31 + 4;
  }
  __return_storage_ptr__->data = pcVar27;
  __return_storage_ptr__->width = width;
  __return_storage_ptr__->height = height;
  __return_storage_ptr__->mipmaps = 1;
  __return_storage_ptr__->format = 7;
  return __return_storage_ptr__;
}

Assistant:

Image GenImageGradientLinear(int width, int height, int direction, Color start, Color end)
{
    Color *pixels = (Color *)RL_MALLOC(width*height*sizeof(Color));

    float radianDirection = (float)(90 - direction)/180.f*3.14159f;
    float cosDir = cosf(radianDirection);
    float sinDir = sinf(radianDirection);

    // Calculate how far the top-left pixel is along the gradient direction from the center of said gradient
    float startingPos = 0.5f - (cosDir*width/2) - (sinDir*height/2);
    // With directions that lie in the first or third quadrant (i.e. from top-left to 
    // bottom-right or vice-versa), pixel (0, 0) is the farthest point on the gradient
    // (i.e. the pixel which should become one of the gradient's ends color); while for
    // directions that lie in the second or fourth quadrant, that point is pixel (width, 0).
    float maxPosValue = 
            ((signbit(sinDir) != 0) == (signbit(cosDir) != 0))
            ? fabsf(startingPos)
            : fabsf(startingPos+width*cosDir);
    for (int i = 0; i < width; i++)
    {
        for (int j = 0; j < height; j++)
        {
            // Calculate the relative position of the pixel along the gradient direction
            float pos = (startingPos + (i*cosDir + j*sinDir)) / maxPosValue;

            float factor = pos;
            factor = (factor > 1.0f)? 1.0f : factor;  // Clamp to [-1,1]
            factor = (factor < -1.0f)? -1.0f : factor;  // Clamp to [-1,1]
            factor = factor / 2 + 0.5f;

            // Generate the color for this pixel
            pixels[j*width + i].r = (int)((float)end.r*factor + (float)start.r*(1.0f - factor));
            pixels[j*width + i].g = (int)((float)end.g*factor + (float)start.g*(1.0f - factor));
            pixels[j*width + i].b = (int)((float)end.b*factor + (float)start.b*(1.0f - factor));
            pixels[j*width + i].a = (int)((float)end.a*factor + (float)start.a*(1.0f - factor));
        }
    }

    Image image = {
        .data = pixels,
        .width = width,
        .height = height,
        .format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8,
        .mipmaps = 1
    };

    return image;
}